

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::emit_legacy_f16_to_f32_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Builder *this;
  Operation *this_00;
  Value *value;
  Operation *this_01;
  
  this = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  IVar1 = spv::Builder::makeFloatType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  this_00 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
  Operation::add_id(this_00,impl->glsl_std450_ext);
  Operation::add_literal(this_00,0x3e);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpCompositeExtract,(Value *)instruction);
  Operation::add_id(this_01,this_00->id);
  Operation::add_literal(this_01,0);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_legacy_f16_to_f32_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *unpack_op = impl.allocate(spv::OpExtInst, builder.makeVectorType(builder.makeFloatType(32), 2));
	unpack_op->add_id(impl.glsl_std450_ext);
	unpack_op->add_literal(GLSLstd450UnpackHalf2x16);
	unpack_op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	impl.add(unpack_op);

	// By construction, these are relaxed precision, but spams lots of unrelated shader changes,
	// and doesn't make too much sense to add ...
	//builder.addDecoration(unpack_op->id, spv::DecorationRelaxedPrecision);

	Operation *op = impl.allocate(spv::OpCompositeExtract, instruction);
	op->add_id(unpack_op->id);
	op->add_literal(0);
	impl.add(op);

	// By construction, these are relaxed precision, but spams lots of unrelated shader changes,
	// and doesn't make too much sense to add ...
	//builder.addDecoration(op->id, spv::DecorationRelaxedPrecision);

	return true;
}